

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_frigidaura(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected(ch,(int)gsn_frigidaura);
  if (bVar1) {
    send_to_char("You are already surrounded by an aura of cold.\n\r",ch);
    return;
  }
  init_affect(&AStack_88);
  AStack_88.where = 3;
  AStack_88.type = (short)sn;
  AStack_88.aftype = 0;
  AStack_88.location = 0;
  AStack_88.modifier = 0;
  AStack_88.duration = (short)(level / 3);
  AStack_88.mod_name = 0xc;
  AStack_88.bitvector[0]._1_1_ = AStack_88.bitvector[0]._1_1_ | 1;
  AStack_88.level = (short)level;
  affect_to_char(ch,&AStack_88);
  AStack_88.where = 4;
  zero_vector(AStack_88.bitvector);
  AStack_88.bitvector[0]._0_1_ = (byte)AStack_88.bitvector[0] | 0x80;
  affect_to_char(ch,&AStack_88);
  act("You chill the air around you, prepared to lash out at any who come near.",ch,(void *)0x0,
      (void *)0x0,3);
  act("$n is briefly surrounded by an aura of ice, which rapidly fades away.",ch,(void *)0x0,
      (void *)0x0,0);
  return;
}

Assistant:

void spell_frigidaura(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_frigidaura))
	{
		send_to_char("You are already surrounded by an aura of cold.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_RESIST;
	af.type = sn;
	af.aftype = AFT_SPELL;
	af.location = 0;
	af.modifier = 0;
	af.level = level;
	af.duration = level / 3;
	af.mod_name = MOD_RESISTANCE;

	SET_BIT(af.bitvector, RES_COLD);

	affect_to_char(ch, &af);

	af.where = TO_VULN;
	zero_vector(af.bitvector);

	SET_BIT(af.bitvector, VULN_FIRE);

	affect_to_char(ch, &af);

	act("You chill the air around you, prepared to lash out at any who come near.", ch, 0, 0, TO_CHAR);
	act("$n is briefly surrounded by an aura of ice, which rapidly fades away.", ch, 0, 0, TO_ROOM);
}